

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-connection-fail.c
# Opt level: O0

void on_connect_with_close(uv_connect_t *req,int status)

{
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  void *eval_b;
  void *eval_a;
  int status_local;
  uv_connect_t *req_local;
  
  if ((uv_tcp_t *)req->handle != &tcp) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-connection-fail.c"
            ,0x45,"(uv_stream_t*) &tcp","==","req->handle",&tcp,"==",(uv_tcp_t *)req->handle);
    abort();
  }
  if ((long)status != -0x6f) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-connection-fail.c"
            ,0x46,"status","==","UV_ECONNREFUSED",(long)status,"==",0xffffffffffffff91);
    abort();
  }
  connect_cb_calls = connect_cb_calls + 1;
  if ((long)close_cb_calls != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-connection-fail.c"
            ,0x49,"close_cb_calls","==","0",(long)close_cb_calls,"==",0);
    abort();
  }
  uv_close((uv_handle_t *)req->handle,on_close);
  return;
}

Assistant:

static void on_connect_with_close(uv_connect_t *req, int status) {
  ASSERT_PTR_EQ((uv_stream_t*) &tcp, req->handle);
  ASSERT_EQ(status, UV_ECONNREFUSED);
  connect_cb_calls++;

  ASSERT_OK(close_cb_calls);
  uv_close((uv_handle_t*)req->handle, on_close);
}